

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O0

void __thiscall CLI::App::run_callback(App *this)

{
  bool bVar1;
  reference ppAVar2;
  App *subc;
  iterator __end2;
  iterator __begin2;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> *__range2;
  App *this_local;
  
  (**this->_vptr_App)();
  bVar1 = ::std::function::operator_cast_to_bool((function *)&this->callback_);
  if (bVar1) {
    std::function<void_()>::operator()(&this->callback_);
  }
  get_subcommands((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)&__begin2,this,true);
  __end2 = std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::begin
                     ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)&__begin2);
  subc = (App *)std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::end
                          ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)&__begin2);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<CLI::App_**,_std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>_>
                                     *)&subc), bVar1) {
    ppAVar2 = __gnu_cxx::
              __normal_iterator<CLI::App_**,_std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>_>
              ::operator*(&__end2);
    run_callback(*ppAVar2);
    __gnu_cxx::__normal_iterator<CLI::App_**,_std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>_>
    ::operator++(&__end2);
  }
  std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::~vector
            ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)&__begin2);
  return;
}

Assistant:

void run_callback() {
        pre_callback();
        if(callback_)
            callback_();
        for(App *subc : get_subcommands()) {
            subc->run_callback();
        }
    }